

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCubeArray_GL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureCubeArray_GL::UpdateData
          (TextureCubeArray_GL *this,GLContextState *ContextState,Uint32 MipLevel,Uint32 Slice,
          Box *DstBox,TextureSubResData *SubresData)

{
  uint uVar1;
  GLenum GVar2;
  GLint GVar3;
  GLint GVar4;
  GLenum GVar5;
  GLenum GVar6;
  PFNGLTEXSUBIMAGE3DPROC p_Var7;
  PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC p_Var8;
  Uint32 UVar9;
  GLContextState *this_00;
  Uint32 UVar10;
  Uint32 UVar11;
  int iVar12;
  Uint32 UVar13;
  GLBufferObj *this_01;
  uint *puVar14;
  Char *pCVar15;
  TextureFormatAttribs *pTVar16;
  NativePixelAttribs NVar17;
  char (*in_stack_fffffffffffffda8) [2];
  void *local_210;
  void *local_1d0;
  GLTextureObj local_17c;
  undefined1 local_170 [8];
  string msg_3;
  ulong uStack_148;
  GLenum err;
  undefined1 local_140 [8];
  string msg_2;
  Uint32 PixelSize;
  TextureFormatAttribs TexFmtInfo;
  uint local_100;
  uint local_fc;
  Uint32 local_f8;
  Uint32 local_f4;
  Uint32 UpdateRegionHeight;
  Uint32 UpdateRegionWidth;
  string msg_1;
  Uint32 BlockBytesInRow;
  TextureFormatAttribs *FmtAttribs;
  undefined1 local_b0 [8];
  string msg;
  uint local_84;
  uint MipHeight;
  uint local_7c;
  undefined8 uStack_78;
  uint MipWidth;
  undefined1 local_70;
  undefined8 local_64;
  undefined1 local_5c;
  GLenum *local_58;
  NativePixelAttribs *TransferAttribs;
  BufferGLImpl *pBufferGL;
  TextureSubResData *pTStack_40;
  GLuint UnpackBuffer;
  TextureSubResData *SubresData_local;
  Box *DstBox_local;
  Uint32 Slice_local;
  Uint32 MipLevel_local;
  GLContextState *ContextState_local;
  TextureCubeArray_GL *this_local;
  
  pTStack_40 = SubresData;
  SubresData_local = (TextureSubResData *)DstBox;
  DstBox_local._0_4_ = Slice;
  DstBox_local._4_4_ = MipLevel;
  _Slice_local = ContextState;
  ContextState_local = (GLContextState *)this;
  TextureBaseGL::UpdateData
            (&this->super_TextureBaseGL,ContextState,MipLevel,Slice,DstBox,SubresData);
  GLContextState::BindTexture
            (_Slice_local,-1,(this->super_TextureBaseGL).m_BindTarget,
             &(this->super_TextureBaseGL).m_GlTexture);
  pBufferGL._4_4_ = 0;
  if (pTStack_40->pSrcBuffer != (IBuffer *)0x0) {
    TransferAttribs =
         (NativePixelAttribs *)
         ClassPtrCast<Diligent::BufferGLImpl,Diligent::IBuffer>(pTStack_40->pSrcBuffer);
    this_01 = BufferGLImpl::GetGLHandle((BufferGLImpl *)TransferAttribs);
    pBufferGL._4_4_ =
         GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)this_01);
  }
  (*__glewBindBuffer)(0x88ec,pBufferGL._4_4_);
  NVar17 = GetNativePixelTransferAttribs
                     ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  uStack_78 = NVar17._0_8_;
  local_70 = NVar17.IsCompressed;
  local_58 = (GLenum *)&local_64;
  local_64 = uStack_78;
  local_5c = local_70;
  glPixelStorei(0xcf5,4);
  glPixelStorei(0xcf4,0);
  glPixelStorei(0xcf3,0);
  if ((local_58[2] & 1) == 0) {
    pTVar16 = GetTextureFormatAttribs
                        ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>
                         .
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         .m_Desc.Format);
    pCVar15 = *(Char **)&pTVar16->Format;
    TexFmtInfo.Name._3_1_ = (byte)((ulong)pCVar15 >> 0x18);
    TexFmtInfo.Name._2_1_ = (byte)((ulong)pCVar15 >> 0x10);
    msg_2.field_2._12_4_ = (uint)TexFmtInfo.Name._3_1_ * (uint)TexFmtInfo.Name._2_1_;
    TexFmtInfo.Name = pCVar15;
    if (pTStack_40->Stride % (ulong)(uint)msg_2.field_2._12_4_ != 0) {
      FormatString<char[42]>
                ((string *)local_140,(char (*) [42])"Data stride is not multiple of pixel size");
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                 ,0xe5);
      std::__cxx11::string::~string((string *)local_140);
    }
    uStack_148 = pTStack_40->Stride / (ulong)(uint)msg_2.field_2._12_4_;
    iVar12 = StaticCast<int,unsigned_long>(&stack0xfffffffffffffeb8);
    glPixelStorei(0xcf2,iVar12);
    UVar9 = DstBox_local._4_4_;
    UVar10 = (Uint32)DstBox_local;
    p_Var7 = __glewTexSubImage3D;
    GVar2 = (this->super_TextureBaseGL).m_BindTarget;
    GVar3 = *(GLint *)&SubresData_local->pData;
    GVar4 = *(GLint *)&SubresData_local->pSrcBuffer;
    UVar13 = Box::Width((Box *)SubresData_local);
    UVar11 = Box::Height((Box *)SubresData_local);
    GVar5 = *local_58;
    GVar6 = local_58[1];
    if (pTStack_40->pSrcBuffer == (IBuffer *)0x0) {
      local_210 = pTStack_40->pData;
    }
    else {
      local_210 = (void *)StaticCast<unsigned_long,unsigned_long>(&pTStack_40->SrcOffset);
    }
    (*p_Var7)(GVar2,UVar9,GVar3,GVar4,UVar10,UVar13,UVar11,1,GVar5,GVar6,local_210);
  }
  else {
    MipHeight = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                .m_Desc.Width >> ((byte)DstBox_local._4_4_ & 0x1f);
    local_84 = 1;
    puVar14 = std::max<unsigned_int>(&MipHeight,&local_84);
    local_7c = *puVar14;
    msg.field_2._12_4_ =
         (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
         .m_Desc.Height >> ((byte)DstBox_local._4_4_ & 0x1f);
    msg.field_2._8_4_ = 1;
    puVar14 = std::max<unsigned_int>
                        ((uint *)(msg.field_2._M_local_buf + 0xc),
                         (uint *)(msg.field_2._M_local_buf + 8));
    uVar1 = *puVar14;
    if ((((((ulong)SubresData_local->pData & 3) != 0) ||
         (((ulong)SubresData_local->pSrcBuffer & 3) != 0)) ||
        ((((ulong)SubresData_local->pData & 0x300000000) != 0 &&
         (*(uint *)((long)&SubresData_local->pData + 4) != local_7c)))) ||
       ((((ulong)SubresData_local->pSrcBuffer & 0x300000000) != 0 &&
        (*(uint *)((long)&SubresData_local->pSrcBuffer + 4) != uVar1)))) {
      FormatString<char[57]>
                ((string *)local_b0,
                 (char (*) [57])"Compressed texture update region must be 4 pixel-aligned");
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                 ,0xb9);
      std::__cxx11::string::~string((string *)local_b0);
    }
    pTVar16 = GetTextureFormatAttribs
                        ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>
                         .
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         .m_Desc.Format);
    UVar10 = Box::Width((Box *)SubresData_local);
    msg_1.field_2._12_4_ = (UVar10 + 3 >> 2) * (uint)pTVar16->ComponentSize;
    if (pTStack_40->Stride != (ulong)(uint)msg_1.field_2._12_4_) {
      FormatString<char[25],unsigned_long,char[53],unsigned_int,char[2]>
                ((string *)&UpdateRegionHeight,(Diligent *)"Compressed data stride (",
                 (char (*) [25])&pTStack_40->Stride,
                 (unsigned_long *)" must match the size of a row of compressed blocks (",
                 (char (*) [53])((long)&msg_1.field_2 + 0xc),(uint *)0xf65f2d,
                 in_stack_fffffffffffffda8);
      pCVar15 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar15,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                 ,0xc0);
      std::__cxx11::string::~string((string *)&UpdateRegionHeight);
    }
    glPixelStorei(0xcf2,0);
    local_f4 = Box::Width((Box *)SubresData_local);
    local_f8 = Box::Height((Box *)SubresData_local);
    local_fc = local_7c - *(int *)&SubresData_local->pData;
    puVar14 = std::min<unsigned_int>(&local_f4,&local_fc);
    local_f4 = *puVar14;
    local_100 = uVar1 - *(int *)&SubresData_local->pSrcBuffer;
    puVar14 = std::min<unsigned_int>(&local_f8,&local_100);
    UVar13 = DstBox_local._4_4_;
    UVar9 = (Uint32)DstBox_local;
    UVar10 = local_f4;
    p_Var8 = __glewCompressedTexSubImage3D;
    uVar1 = *puVar14;
    GVar2 = (this->super_TextureBaseGL).m_BindTarget;
    GVar3 = *(GLint *)&SubresData_local->pData;
    GVar4 = *(GLint *)&SubresData_local->pSrcBuffer;
    GVar5 = (this->super_TextureBaseGL).m_GLTexFormat;
    local_f8 = uVar1;
    UVar11 = Box::Height((Box *)SubresData_local);
    TexFmtInfo._8_8_ = (ulong)(UVar11 + 3 >> 2) * pTStack_40->Stride;
    iVar12 = StaticCast<int,unsigned_long>((unsigned_long *)&TexFmtInfo.Format);
    if (pTStack_40->pSrcBuffer == (IBuffer *)0x0) {
      local_1d0 = pTStack_40->pData;
    }
    else {
      local_1d0 = (void *)StaticCast<unsigned_long,unsigned_long>(&pTStack_40->SrcOffset);
    }
    (*p_Var8)(GVar2,UVar13,GVar3,GVar4,UVar9,UVar10,uVar1,1,GVar5,iVar12,local_1d0);
  }
  msg_3.field_2._12_4_ = glGetError();
  if (msg_3.field_2._12_4_ != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
               ,0xfd,(char (*) [31])"Failed to update subimage data",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 0xc));
    FormatString<char[6]>((string *)local_170,(char (*) [6])0xe8e72e);
    pCVar15 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar15,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
               ,0xfd);
    std::__cxx11::string::~string((string *)local_170);
  }
  if (pBufferGL._4_4_ != 0) {
    (*__glewBindBuffer)(0x88ec,0);
  }
  this_00 = _Slice_local;
  GVar2 = (this->super_TextureBaseGL).m_BindTarget;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::Null();
  GLContextState::BindTexture(this_00,-1,GVar2,&local_17c);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            (&local_17c);
  return;
}

Assistant:

void TextureCubeArray_GL::UpdateData(GLContextState&          ContextState,
                                     Uint32                   MipLevel,
                                     Uint32                   Slice,
                                     const Box&               DstBox,
                                     const TextureSubResData& SubresData)
{
    TextureBaseGL::UpdateData(ContextState, MipLevel, Slice, DstBox, SubresData);

    ContextState.BindTexture(-1, m_BindTarget, m_GlTexture);

    // Bind buffer if it is provided; copy from CPU memory otherwise
    GLuint UnpackBuffer = 0;
    if (SubresData.pSrcBuffer != nullptr)
    {
        auto* pBufferGL = ClassPtrCast<BufferGLImpl>(SubresData.pSrcBuffer);
        UnpackBuffer    = pBufferGL->GetGLHandle();
    }

    // Transfers to OpenGL memory are called unpack operations
    // If there is a buffer bound to GL_PIXEL_UNPACK_BUFFER target, then all the pixel transfer
    // operations will be performed from this buffer.
    glBindBuffer(GL_PIXEL_UNPACK_BUFFER, UnpackBuffer);

    const auto& TransferAttribs = GetNativePixelTransferAttribs(m_Desc.Format);

    glPixelStorei(GL_UNPACK_ALIGNMENT, PBOOffsetAlignment);
    glPixelStorei(GL_UNPACK_SKIP_PIXELS, 0);
    glPixelStorei(GL_UNPACK_SKIP_ROWS, 0);

    if (TransferAttribs.IsCompressed)
    {
        auto MipWidth  = std::max(m_Desc.Width >> MipLevel, 1U);
        auto MipHeight = std::max(m_Desc.Height >> MipLevel, 1U);
        // clang-format off
        VERIFY((DstBox.MinX % 4) == 0 && (DstBox.MinY % 4) == 0 &&
               ((DstBox.MaxX % 4) == 0 || DstBox.MaxX == MipWidth) &&
               ((DstBox.MaxY % 4) == 0 || DstBox.MaxY == MipHeight),
               "Compressed texture update region must be 4 pixel-aligned");
        // clang-format on
#ifdef DILIGENT_DEBUG
        {
            const auto& FmtAttribs      = GetTextureFormatAttribs(m_Desc.Format);
            auto        BlockBytesInRow = ((DstBox.Width() + 3) / 4) * Uint32{FmtAttribs.ComponentSize};
            VERIFY(SubresData.Stride == BlockBytesInRow,
                   "Compressed data stride (", SubresData.Stride, " must match the size of a row of compressed blocks (", BlockBytesInRow, ")");
        }
#endif

        // Every OpenGL API call that operates on cubemap array textures takes layer-faces, not array layers.

        glPixelStorei(GL_UNPACK_ROW_LENGTH, 0); // Must be 0 on WebGL
        //glPixelStorei(GL_UNPACK_COMPRESSED_BLOCK_WIDTH, 0);
        auto UpdateRegionWidth  = DstBox.Width();
        auto UpdateRegionHeight = DstBox.Height();
        UpdateRegionWidth       = std::min(UpdateRegionWidth, MipWidth - DstBox.MinX);
        UpdateRegionHeight      = std::min(UpdateRegionHeight, MipHeight - DstBox.MinY);
        glCompressedTexSubImage3D(m_BindTarget, MipLevel,
                                  DstBox.MinX,
                                  DstBox.MinY,
                                  Slice,
                                  UpdateRegionWidth,
                                  UpdateRegionHeight,
                                  1,
                                  // The format must be the same compressed-texture format previously
                                  // specified by glTexStorage2D() (thank you OpenGL for another useless
                                  // parameter that is nothing but the source of confusion), otherwise
                                  // INVALID_OPERATION error is generated.
                                  m_GLTexFormat,
                                  // An INVALID_VALUE error is generated if imageSize is not consistent with
                                  // the format, dimensions, and contents of the compressed image( too little or
                                  // too much data ),
                                  StaticCast<GLsizei>(((DstBox.Height() + 3) / 4) * SubresData.Stride),
                                  // If a non-zero named buffer object is bound to the GL_PIXEL_UNPACK_BUFFER target, 'data' is treated
                                  // as a byte offset into the buffer object's data store.
                                  // https://www.khronos.org/registry/OpenGL-Refpages/gl4/html/glCompressedTexSubImage3D.xhtml
                                  SubresData.pSrcBuffer != nullptr ? reinterpret_cast<void*>(StaticCast<size_t>(SubresData.SrcOffset)) : SubresData.pData);
    }
    else
    {
        const auto TexFmtInfo = GetTextureFormatAttribs(m_Desc.Format);
        const auto PixelSize  = Uint32{TexFmtInfo.NumComponents} * Uint32{TexFmtInfo.ComponentSize};
        VERIFY((SubresData.Stride % PixelSize) == 0, "Data stride is not multiple of pixel size");
        glPixelStorei(GL_UNPACK_ROW_LENGTH, StaticCast<GLint>(SubresData.Stride / PixelSize));

        // Every OpenGL API call that operates on cubemap array textures takes layer-faces, not array layers.
        // When uploading texel data to the cubemap array, the parameters that represent the Z component
        // are layer-faces. So if you want to upload to just the positive Z face of the second layer in the array,
        // you would use call glTexSubImage3D?, with the zoffset?? parameter set to 10 (layer 1 * 6 faces per layer + face index 4),
        // and the depth? set to 1 (because you're only uploading one layer-face).

        // Target must be GL_TEXTURE_3D, GL_TEXTURE_2D_ARRAY, or GL_TEXTURE_CUBE_MAP_ARRAY.
        // (NO individual cubemap faces GL_TEXTURE_CUBE_MAP_POSITIVE_X .. GL_TEXTURE_CUBE_MAP_NEGATIVE_Z!!!)
        glTexSubImage3D(m_BindTarget, MipLevel,
                        DstBox.MinX,
                        DstBox.MinY,
                        Slice,
                        DstBox.Width(),
                        DstBox.Height(),
                        1,
                        TransferAttribs.PixelFormat, TransferAttribs.DataType,
                        // If a non-zero named buffer object is bound to the GL_PIXEL_UNPACK_BUFFER target, 'data' is treated
                        // as a byte offset into the buffer object's data store.
                        // https://www.khronos.org/registry/OpenGL-Refpages/gl4/html/glTexSubImage3D.xhtml
                        SubresData.pSrcBuffer != nullptr ? reinterpret_cast<void*>(StaticCast<size_t>(SubresData.SrcOffset)) : SubresData.pData);
    }
    DEV_CHECK_GL_ERROR("Failed to update subimage data");

    if (UnpackBuffer != 0)
        glBindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);

    ContextState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}